

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O3

void __thiscall String::String(String *this,char *str)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"String constructor!",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  if (str == (char *)0x0) {
    pcVar2 = (char *)operator_new__(1);
    this->m_data = pcVar2;
    *pcVar2 = '\0';
    sVar3 = 0;
  }
  else {
    sVar1 = strlen(str);
    pcVar2 = (char *)operator_new__((long)((int)sVar1 + 1));
    this->m_data = pcVar2;
    strcpy(pcVar2,str);
    sVar3 = (size_t)(int)sVar1;
  }
  this->m_size = sVar3;
  return;
}

Assistant:

String::String(const char* str)
{
	cout << "String constructor!" << endl;
	if (str == nullptr) {
		m_data = new char[1];
		*m_data = '\0';
		m_size = 0;

	} else {
		int length = strlen(str);
		m_data = new char[length + 1];
		strcpy(m_data, str);
		m_size = length;
	}
}